

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::CompressedCubeFormatCase::iterate(CompressedCubeFormatCase *this)

{
  bool bVar1;
  IterateResult IVar2;
  int iVar3;
  char *description;
  
  bVar1 = testFace(this,this->m_curFace);
  if (!bVar1) {
    this->m_isOk = false;
  }
  iVar3 = this->m_curFace + 1;
  this->m_curFace = iVar3;
  IVar2 = CONTINUE;
  if (iVar3 == 6) {
    description = "Image comparison failed";
    if (this->m_isOk != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,this->m_isOk ^ QP_TEST_RESULT_FAIL,
               description);
    IVar2 = STOP;
  }
  return IVar2;
}

Assistant:

CompressedCubeFormatCase::IterateResult CompressedCubeFormatCase::iterate (void)
{
	// Execute test for all faces.
	if (!testFace((tcu::CubeFace)m_curFace))
		m_isOk = false;

	m_curFace += 1;

	if (m_curFace == tcu::CUBEFACE_LAST)
	{
		m_testCtx.setTestResult(m_isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								m_isOk ? "Pass"					: "Image comparison failed");
		return STOP;
	}
	else
		return CONTINUE;
}